

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOSXBundleGenerator.cxx
# Opt level: O0

void __thiscall
cmOSXBundleGenerator::CreateCFBundle(cmOSXBundleGenerator *this,string *targetName,string *root)

{
  cmGeneratorTarget *target;
  cmLocalGenerator *this_00;
  bool bVar1;
  char *pcVar2;
  undefined1 local_f0 [8];
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_90 [8];
  string plist;
  undefined1 local_40 [8];
  string out;
  string *root_local;
  string *targetName_local;
  cmOSXBundleGenerator *this_local;
  
  out.field_2._8_8_ = root;
  bVar1 = MustSkip(this);
  if (!bVar1) {
    std::__cxx11::string::string((string *)local_40,(string *)out.field_2._8_8_);
    std::__cxx11::string::operator+=((string *)local_40,"/");
    cmGeneratorTarget::GetCFBundleDirectory
              ((string *)((long)&plist.field_2 + 8),this->GT,&this->ConfigName,false);
    std::__cxx11::string::operator+=((string *)local_40,(string *)(plist.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(plist.field_2._M_local_buf + 8));
    pcVar2 = (char *)std::__cxx11::string::c_str();
    cmsys::SystemTools::MakeDirectory(pcVar2);
    cmMakefile::AddCMakeOutputFile(this->Makefile,(string *)local_40);
    std::operator+(&local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   out.field_2._8_8_,"/");
    cmGeneratorTarget::GetCFBundleDirectory
              ((string *)((long)&name.field_2 + 8),this->GT,&this->ConfigName,true);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                   &local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&name.field_2 + 8));
    std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::operator+=((string *)local_90,"/Info.plist");
    cmsys::SystemTools::GetFilenameName((string *)local_f0,targetName);
    target = this->GT;
    this_00 = this->LocalGenerator;
    pcVar2 = (char *)std::__cxx11::string::c_str();
    cmLocalGenerator::GenerateAppleInfoPList(this_00,target,(string *)local_f0,pcVar2);
    cmMakefile::AddCMakeOutputFile(this->Makefile,(string *)local_90);
    std::__cxx11::string::~string((string *)local_f0);
    std::__cxx11::string::~string((string *)local_90);
    std::__cxx11::string::~string((string *)local_40);
  }
  return;
}

Assistant:

void cmOSXBundleGenerator::CreateCFBundle(const std::string& targetName,
                                          const std::string& root)
{
  if (this->MustSkip())
    return;

  // Compute bundle directory names.
  std::string out = root;
  out += "/";
  out += this->GT->GetCFBundleDirectory(this->ConfigName, false);
  cmSystemTools::MakeDirectory(out.c_str());
  this->Makefile->AddCMakeOutputFile(out);

  // Configure the Info.plist file.  Note that it needs the executable name
  // to be set.
  std::string plist = root + "/" +
    this->GT->GetCFBundleDirectory(this->ConfigName, true);
  plist += "/Info.plist";
  std::string name = cmSystemTools::GetFilenameName(targetName);
  this->LocalGenerator->GenerateAppleInfoPList(this->GT,
                                               name,
                                               plist.c_str());
  this->Makefile->AddCMakeOutputFile(plist);
}